

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O0

void __thiscall flow::lang::BuiltinHandlerSym::~BuiltinHandlerSym(BuiltinHandlerSym *this)

{
  BuiltinHandlerSym *this_local;
  
  ~BuiltinHandlerSym(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

explicit BuiltinHandlerSym(const NativeCallback& cb)
      : CallableSym(Symbol::BuiltinHandler, &cb, SourceLocation()) {}